

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  byte *pbVar1;
  byte bVar2;
  short sVar3;
  u16 uVar4;
  Table *pTab;
  sqlite3 *db;
  _func_int_char_ptr *z;
  Index *pIdx;
  i16 *piVar5;
  undefined4 uVar6;
  LogEst LVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  void *pvVar12;
  Vdbe *pVVar13;
  Parse *pPVar14;
  Table *pTable;
  VdbeOp *pVVar15;
  Expr *pExpr;
  ExprList *pList;
  Index *pIVar16;
  Token *pTVar17;
  ushort uVar18;
  u8 *puVar19;
  char *pcVar20;
  char *pcVar21;
  ulong uVar22;
  Column *pCVar23;
  int iVar24;
  int iVar25;
  char *zFormat;
  Index **ppIVar26;
  long lVar27;
  char *pcVar28;
  char *zBuf;
  bool bVar29;
  char *local_b0;
  uint local_a0;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if (((db->init).busy != '\0') && (iVar8 = (db->init).newTnum, pTab->tnum = iVar8, iVar8 == 1)) {
    *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
  }
  if ((tabOpts & 0x20) != 0) {
    uVar11 = pTab->tabFlags;
    if ((uVar11 & 8) != 0) {
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if ((uVar11 & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    }
    else {
      pTab->tabFlags = uVar11 | 0x60;
      pVVar13 = pParse->pVdbe;
      if ((db->init).imposterTable == '\0') {
        uVar18 = pTab->nCol;
        lVar27 = 0;
        if ((short)uVar18 < 1) {
          uVar18 = 0;
        }
        for (; (ulong)uVar18 * 0x20 != lVar27; lVar27 = lVar27 + 0x20) {
          if (((&pTab->aCol->colFlags)[lVar27] & 1) != 0) {
            (&pTab->aCol->notNull)[lVar27] = '\x02';
          }
        }
      }
      if (pParse->declareVtab == '\0') {
        if (pParse->addrCrTab != 0) {
          pVVar15 = sqlite3VdbeGetOp(pVVar13,pParse->addrCrTab);
          pVVar15->opcode = 0x86;
        }
        if ((long)pTab->iPKey < 0) {
          pIVar16 = sqlite3PrimaryKeyIndex(pTab);
          iVar8 = 1;
          for (uVar22 = 1; uVar22 < pIVar16->nKeyCol; uVar22 = uVar22 + 1) {
            piVar5 = pIVar16->aiColumn;
            sVar3 = piVar5[uVar22];
            iVar9 = hasColumn(piVar5,iVar8,(int)sVar3);
            if (iVar9 == 0) {
              lVar27 = (long)iVar8;
              iVar8 = iVar8 + 1;
              piVar5[lVar27] = sVar3;
            }
            else {
              pIVar16->nColumn = pIVar16->nColumn - 1;
            }
          }
          pIVar16->nKeyCol = (u16)iVar8;
        }
        else {
          dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
          iVar8 = sqlite3Strlen30((char *)dest._0_8_);
          dest.iSdst = iVar8;
          pExpr = sqlite3ExprAlloc(db,0x1b,(Token *)&dest,0);
          pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
          if (pList == (ExprList *)0x0) goto LAB_0024292c;
          pList->a[0].sortOrder = pParse->iPkSortOrder;
          sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                             (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0,'\x02');
          if (db->mallocFailed != '\0') goto LAB_0024292c;
          pIVar16 = sqlite3PrimaryKeyIndex(pTab);
          pTab->iPKey = -1;
        }
        bVar2 = pIVar16->field_0x63;
        pIVar16->field_0x63 = bVar2 | 0x20;
        if ((db->init).imposterTable == '\0') {
          pIVar16->field_0x63 = bVar2 | 0x28;
        }
        local_a0 = (uint)pIVar16->nKeyCol;
        if ((pVVar13 != (Vdbe *)0x0) && (0 < pIVar16->tnum)) {
          pVVar15 = sqlite3VdbeGetOp(pVVar13,pIVar16->tnum);
          pVVar15->opcode = '\r';
        }
        pIVar16->tnum = pTab->tnum;
        ppIVar26 = &pTab->pIndex;
        while (pIdx = *ppIVar26, pIdx != (Index *)0x0) {
          if ((pIdx->field_0x63 & 3) != 2) {
            uVar18 = pIdx->nKeyCol;
            iVar8 = 0;
            for (uVar22 = 0; local_a0 != uVar22; uVar22 = uVar22 + 1) {
              uVar11 = hasColumn(pIdx->aiColumn,(uint)uVar18,(int)pIVar16->aiColumn[uVar22]);
              iVar8 = iVar8 + (uVar11 ^ 1);
            }
            if (iVar8 == 0) {
              pIdx->nColumn = uVar18;
            }
            else {
              iVar8 = resizeIndexObject(db,pIdx,iVar8 + (uint)uVar18);
              if (iVar8 != 0) goto LAB_0024292c;
              uVar11 = (uint)pIdx->nKeyCol;
              for (uVar22 = 0; local_a0 != uVar22; uVar22 = uVar22 + 1) {
                piVar5 = pIdx->aiColumn;
                sVar3 = pIVar16->aiColumn[uVar22];
                iVar8 = hasColumn(piVar5,(uint)pIdx->nKeyCol,(int)sVar3);
                if (iVar8 == 0) {
                  piVar5[(int)uVar11] = sVar3;
                  pIdx->azColl[(int)uVar11] = pIVar16->azColl[uVar22];
                  uVar11 = uVar11 + 1;
                }
              }
            }
          }
          ppIVar26 = &pIdx->pNext;
        }
        uVar4 = pTab->nCol;
        if ((int)local_a0 < (int)(short)uVar4) {
          iVar8 = resizeIndexObject(db,pIVar16,(int)(short)uVar4);
          if (iVar8 == 0) {
            for (iVar8 = 0; iVar8 < pTab->nCol; iVar8 = iVar8 + 1) {
              piVar5 = pIVar16->aiColumn;
              iVar9 = hasColumn(piVar5,local_a0,iVar8);
              if (iVar9 == 0) {
                piVar5[(int)local_a0] = (i16)iVar8;
                pIVar16->azColl[(int)local_a0] = "BINARY";
                local_a0 = local_a0 + 1;
              }
            }
          }
        }
        else {
          pIVar16->nColumn = uVar4;
        }
      }
    }
  }
LAB_0024292c:
  iVar8 = sqlite3SchemaToIndex(db,pTab->pSchema);
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  puVar19 = &pTab->aCol->szEst;
  iVar24 = 0;
  for (iVar9 = (int)pTab->nCol; 0 < iVar9; iVar9 = iVar9 + -1) {
    iVar24 = iVar24 + (uint)*puVar19;
    puVar19 = puVar19 + 0x20;
  }
  LVar7 = sqlite3LogEst((ulong)((iVar24 + (uint)((ushort)pTab->iPKey >> 0xf)) * 4));
  pTab->szTabRow = LVar7;
  ppIVar26 = &pTab->pIndex;
  while (pIVar16 = *ppIVar26, pIVar16 != (Index *)0x0) {
    estimateIndexWidth(pIVar16);
    ppIVar26 = &pIVar16->pNext;
  }
  if ((db->init).busy == '\0') {
    pVVar13 = sqlite3GetVdbe(pParse);
    if (pVVar13 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp1(pVVar13,0x70,0);
    bVar29 = pTab->pSelect == (Select *)0x0;
    pcVar21 = "VIEW";
    if (bVar29) {
      pcVar21 = "TABLE";
    }
    pcVar20 = "view";
    if (bVar29) {
      pcVar20 = "table";
    }
    if (pSelect == (Select *)0x0) {
      pTVar17 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar17 = pEnd;
      }
      uVar11 = (int)pTVar17->z - (int)(pParse->sNameToken).z;
      if (*pTVar17->z != ';') {
        uVar11 = uVar11 + pTVar17->n;
      }
      local_b0 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar21,(ulong)uVar11);
    }
    else {
      iVar9 = pParse->nMem;
      iVar25 = iVar9 + 1;
      iVar24 = iVar9 + 3;
      pParse->nMem = iVar24;
      pPVar14 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar14 = pParse;
      }
      pPVar14->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar13,0x69,1,pParse->regRoot,iVar8);
      iVar10 = pVVar13->nOp;
      if (0 < (long)iVar10) {
        pVVar13->aOp[(long)iVar10 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar13,0xf,iVar25,0,iVar10 + 1);
      dest.eDest = '\r';
      dest.iSDParm = iVar25;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.zAffSdst = (char *)0x0;
      sqlite3Select(pParse,pSelect,&dest);
      sqlite3VdbeEndCoroutine(pVVar13,iVar25);
      sqlite3VdbeJumpHere(pVVar13,iVar10);
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTable == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTable->nCol;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTable);
      iVar25 = sqlite3VdbeAddOp1(pVVar13,0x10,dest.iSDParm);
      sqlite3VdbeAddOp3(pVVar13,99,dest.iSdst,dest.nSdst,iVar9 + 2);
      lVar27 = 0;
      sqlite3TableAffinity(pVVar13,pTab,0);
      sqlite3VdbeAddOp2(pVVar13,0x73,1,iVar24);
      sqlite3VdbeAddOp3(pVVar13,0x74,1,iVar9 + 2,iVar24);
      sqlite3VdbeGoto(pVVar13,iVar25);
      sqlite3VdbeJumpHere(pVVar13,iVar25);
      sqlite3VdbeAddOp1(pVVar13,0x70,1);
      pCVar23 = pTab->aCol;
      sVar3 = pTab->nCol;
      iVar9 = 0;
      if (0 < sVar3) {
        iVar9 = (int)sVar3;
      }
      iVar24 = 0;
      for (; iVar9 << 5 != (int)lVar27; lVar27 = lVar27 + 0x20) {
        iVar25 = identLength(*(char **)((long)&pCVar23->zName + lVar27));
        iVar24 = iVar24 + iVar25 + 5;
      }
      iVar9 = identLength(pTab->zName);
      iVar9 = iVar9 + iVar24;
      pcVar21 = ",\n  ";
      if (iVar9 < 0x32) {
        pcVar21 = ",";
      }
      pcVar28 = "\n)";
      if (iVar9 < 0x32) {
        pcVar28 = ")";
      }
      iVar24 = sVar3 * 6 + iVar9 + 0x23;
      local_b0 = (char *)sqlite3Malloc((long)iVar24);
      if (local_b0 == (char *)0x0) {
        sqlite3OomFault(db);
      }
      else {
        zFormat = "\n  ";
        if (iVar9 < 0x32) {
          zFormat = "";
        }
        sqlite3_snprintf(iVar24,local_b0,"CREATE TABLE ");
        iVar9 = sqlite3Strlen30(local_b0);
        dest._0_4_ = iVar9;
        identPut(local_b0,(int *)&dest,pTab->zName);
        iVar25 = dest._0_4_ + 1;
        local_b0[(int)dest._0_4_] = '(';
        pCVar23 = pTab->aCol;
        iVar9 = 0;
        while( true ) {
          zBuf = local_b0 + iVar25;
          if (pTab->nCol <= iVar9) break;
          sqlite3_snprintf(iVar24 - iVar25,zBuf,zFormat);
          iVar10 = sqlite3Strlen30(zBuf);
          dest._0_4_ = iVar10 + iVar25;
          identPut(local_b0,(int *)&dest,pCVar23->zName);
          z = (&sqlite3Apis.compileoption_used)[pCVar23->affinity];
          uVar11 = sqlite3Strlen30((char *)z);
          uVar6 = dest._0_4_;
          memcpy(local_b0 + (int)dest._0_4_,z,(ulong)uVar11);
          iVar25 = uVar11 + uVar6;
          dest._0_4_ = iVar25;
          iVar9 = iVar9 + 1;
          pCVar23 = pCVar23 + 1;
          zFormat = pcVar21;
        }
        sqlite3_snprintf(iVar24 - iVar25,zBuf,"%s",pcVar28);
      }
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar8].zDbSName,"sqlite_master",pcVar20,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,local_b0,(ulong)(uint)pParse->regRowid);
    sqlite3DbFree(db,local_b0);
    sqlite3ChangeCookie(pParse,iVar8);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar8].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar8].zDbSName)
      ;
    }
    pcVar21 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar13,iVar8,pcVar21);
    if ((db->init).busy == '\0') {
      return;
    }
  }
  pvVar12 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
  if (pvVar12 == (void *)0x0) {
    pParse->pNewTable = (Table *)0x0;
    pbVar1 = (byte *)((long)&db->flags + 2);
    *pbVar1 = *pbVar1 | 0x80;
    if (pTab->pSelect == (Select *)0x0) {
      pcVar21 = (pParse->sNameToken).z;
      if (pCons->z != (char *)0x0) {
        pEnd = pCons;
      }
      iVar8 = sqlite3Utf8CharLen(pcVar21,*(int *)&pEnd->z - (int)pcVar21);
      pTab->addColOffset = iVar8 + 0xd;
    }
  }
  else {
    sqlite3OomFault(db);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  assert( !db->init.busy || !pSelect );

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->flags |= SQLITE_InternChanges;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}